

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineArguments_printUsage_Test::TEST_CommandLineArguments_printUsage_Test
          (TEST_CommandLineArguments_printUsage_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args = (CommandLineArguments *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).plugin = (OptionsPlugin *)0x0;
  TEST_GROUP_CppUTestGroupCommandLineArguments::TEST_GROUP_CppUTestGroupCommandLineArguments
            (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments);
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_00344368;
  return;
}

Assistant:

TEST(CommandLineArguments, printUsage)
{
    STRCMP_EQUAL(
            "use -h for more extensive help\n"
            "usage [-h] [-v] [-vv] [-c] [-p] [-lg] [-ln] [-ll] [-ri] [-r[<#>]] [-f] [-e] [-ci]\n"
            "      [-g|sg|xg|xsg <groupName>]... [-n|sn|xn|xsn <testName>]... [-t|st|xt|xst <groupName>.<testName>]...\n"
            "      [-b] [-s [<seed>]] [\"[IGNORE_]TEST(<groupName>, <testName>)\"]...\n"
            "      [-o{normal|eclipse|junit|teamcity}] [-k <packageName>]\n",
            args->usage());
}